

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

size_t fio_ltoa(char *dest,int64_t num,uint8_t base)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  char cVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  char cStack_39;
  char buf [48];
  
  if (num == 0) {
    uVar1 = (uint)base;
    if (uVar1 - 1 < 2) {
      dest[0] = '0';
      dest[1] = 'b';
      lVar9 = 2;
    }
    else if (uVar1 == 8) {
      *dest = '0';
      lVar9 = 1;
    }
    else if (uVar1 == 0x10) {
      dest[0] = '0';
      dest[1] = 'x';
      dest[2] = '0';
      lVar9 = 3;
    }
    else {
      lVar9 = 0;
    }
    dest[lVar9] = '0';
    sVar2 = lVar9 + 1;
  }
  else {
    uVar3 = (ulong)base;
    switch(base) {
    case '\x01':
    case '\x02':
      dest[0] = '0';
      dest[1] = 'b';
      bVar4 = 0;
      do {
        bVar5 = bVar4;
        if (num < 0) break;
        num = num * 2;
        bVar5 = bVar4 + 1;
        bVar10 = bVar4 < 0x3f;
        bVar4 = bVar5;
      } while (bVar10);
      if (bVar5 == 0) {
        sVar2 = 2;
      }
      else {
        dest[2] = '0';
        sVar2 = 3;
      }
      if (bVar5 < 0x40) {
        cVar6 = (char)sVar2;
        do {
          dest[sVar2] = -1 < num ^ 0x31;
          sVar2 = sVar2 + 1;
          num = num * 2;
        } while ((byte)((cVar6 + '@') - bVar5) != sVar2);
      }
      break;
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\a':
    case '\t':
      bVar10 = num < 0;
      if (bVar10) {
        *dest = '-';
        num = -num;
      }
      sVar2 = (size_t)bVar10;
      lVar9 = 0;
      do {
        buf[lVar9] = (char)((ulong)num % uVar3) + '0';
        lVar9 = lVar9 + 1;
        bVar10 = uVar3 <= (ulong)num;
        num = (ulong)num / uVar3;
      } while (bVar10);
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        dest[sVar2] = buf[lVar9 + -1];
        sVar2 = sVar2 + 1;
      }
      break;
    case '\b':
      bVar10 = num < 0;
      if (bVar10) {
        *dest = '-';
        num = -num;
      }
      uVar3 = (ulong)bVar10;
      dest[uVar3] = '0';
      lVar9 = 0;
      do {
        buf[lVar9] = (byte)num & 7 | 0x30;
        lVar9 = lVar9 + 1;
        bVar10 = 7 < (ulong)num;
        num = (ulong)num >> 3;
      } while (bVar10);
      sVar7 = uVar3 + 1;
      do {
        sVar2 = sVar7 + 1;
        dest[sVar7] = buf[lVar9 + -1];
        lVar9 = lVar9 + -1;
        sVar7 = sVar2;
      } while (lVar9 != 0);
      break;
    default:
      bVar10 = num < 0;
      if (bVar10) {
        *dest = '-';
        num = -num;
      }
      sVar2 = (size_t)bVar10;
      lVar9 = 0;
      do {
        buf[lVar9] = (char)((ulong)num / 10) * -10 + (char)num + '0';
        lVar9 = lVar9 + 1;
        bVar10 = 9 < (ulong)num;
        num = (ulong)num / 10;
      } while (bVar10);
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        dest[sVar2] = buf[lVar9 + -1];
        sVar2 = sVar2 + 1;
      }
      break;
    case '\x10':
      dest[0] = '0';
      dest[1] = 'x';
      uVar3 = (ulong)num >> 0x38;
      bVar4 = 0;
      while (uVar8 = num, bVar5 = bVar4, uVar3 == 0) {
        uVar8 = num << 8;
        bVar5 = bVar4 + 1;
        if (6 < bVar4) break;
        uVar3 = (ulong)num >> 0x30;
        num = uVar8;
        bVar4 = bVar5;
      }
      sVar2 = 2;
      if ((long)uVar8 < 0 && bVar5 != 0) {
        dest[2] = '0';
        dest[3] = '0';
        sVar2 = 4;
      }
      if (bVar5 < 8) {
        cVar6 = bVar5 - 8;
        do {
          dest[sVar2] = "0123456789ABCDEF"[uVar8 >> 0x3c];
          dest[sVar2 + 1] = "0123456789ABCDEF"[(byte)(uVar8 >> 0x38) & 0xf];
          sVar2 = sVar2 + 2;
          uVar8 = uVar8 << 8;
          cVar6 = cVar6 + '\x01';
        } while (cVar6 != '\0');
      }
    }
  }
  dest[sVar2] = '\0';
  return sVar2;
}

Assistant:

size_t fio_ltoa(char *dest, int64_t num, uint8_t base) {
  const char notation[] = {'0', '1', '2', '3', '4', '5', '6', '7',
                           '8', '9', 'A', 'B', 'C', 'D', 'E', 'F'};

  size_t len = 0;
  char buf[48]; /* we only need up to 20 for base 10, but base 3 needs 41... */

  if (!num)
    goto zero;

  switch (base) {
  case 1: /* fallthrough */
  case 2:
    /* Base 2 */
    {
      uint64_t n = num; /* avoid bit shifting inconsistencies with signed bit */
      uint8_t i = 0;    /* counting bits */
      dest[len++] = '0';
      dest[len++] = 'b';

      while ((i < 64) && (n & 0x8000000000000000) == 0) {
        n = n << 1;
        i++;
      }
      /* make sure the Binary representation doesn't appear signed. */
      if (i) {
        dest[len++] = '0';
      }
      /* write to dest. */
      while (i < 64) {
        dest[len++] = ((n & 0x8000000000000000) ? '1' : '0');
        n = n << 1;
        i++;
      }
      dest[len] = 0;
      return len;
    }
  case 8:
    /* Base 8 */
    {
      uint64_t l = 0;
      if (num < 0) {
        dest[len++] = '-';
        num = 0 - num;
      }
      dest[len++] = '0';

      while (num) {
        buf[l++] = '0' + (num & 7);
        num = num >> 3;
      }
      while (l) {
        --l;
        dest[len++] = buf[l];
      }
      dest[len] = 0;
      return len;
    }

  case 16:
    /* Base 16 */
    {
      uint64_t n = num; /* avoid bit shifting inconsistencies with signed bit */
      uint8_t i = 0;    /* counting bits */
      dest[len++] = '0';
      dest[len++] = 'x';
      while (i < 8 && (n & 0xFF00000000000000) == 0) {
        n = n << 8;
        i++;
      }
      /* make sure the Hex representation doesn't appear misleadingly signed. */
      if (i && (n & 0x8000000000000000)) {
        dest[len++] = '0';
        dest[len++] = '0';
      }
      /* write the damn thing, high to low */
      while (i < 8) {
        uint8_t tmp = (n & 0xF000000000000000) >> 60;
        dest[len++] = notation[tmp];
        tmp = (n & 0x0F00000000000000) >> 56;
        dest[len++] = notation[tmp];
        i++;
        n = n << 8;
      }
      dest[len] = 0;
      return len;
    }
  case 3: /* fallthrough */
  case 4: /* fallthrough */
  case 5: /* fallthrough */
  case 6: /* fallthrough */
  case 7: /* fallthrough */
  case 9: /* fallthrough */
    /* rare bases */
    if (num < 0) {
      dest[len++] = '-';
      num = 0 - num;
    }
    uint64_t l = 0;
    while (num) {
      uint64_t t = num / base;
      buf[l++] = '0' + (num - (t * base));
      num = t;
    }
    while (l) {
      --l;
      dest[len++] = buf[l];
    }
    dest[len] = 0;
    return len;

  default:
    break;
  }
  /* Base 10, the default base */

  if (num < 0) {
    dest[len++] = '-';
    num = 0 - num;
  }
  uint64_t l = 0;
  while (num) {
    uint64_t t = num / 10;
    buf[l++] = '0' + (num - (t * 10));
    num = t;
  }
  while (l) {
    --l;
    dest[len++] = buf[l];
  }
  dest[len] = 0;
  return len;

zero:
  switch (base) {
  case 1:
  case 2:
    dest[len++] = '0';
    dest[len++] = 'b';
    break;
  case 8:
    dest[len++] = '0';
    break;
  case 16:
    dest[len++] = '0';
    dest[len++] = 'x';
    dest[len++] = '0';
    break;
  }
  dest[len++] = '0';
  dest[len] = 0;
  return len;
}